

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puff.cpp
# Opt level: O2

int construct(huffman *h,short *length,int n)

{
  short *psVar1;
  short sVar2;
  short *psVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  short offs [16];
  
  psVar3 = h->count;
  for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
    psVar3[lVar5] = 0;
  }
  uVar6 = 0;
  uVar7 = 0;
  if (0 < n) {
    uVar7 = (ulong)(uint)n;
  }
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    psVar3[length[uVar6]] = psVar3[length[uVar6]] + 1;
  }
  iVar4 = 0;
  if (*psVar3 != n) {
    iVar4 = 1;
    lVar5 = 1;
    do {
      if (lVar5 == 0x10) {
        offs[1] = 0;
        for (lVar5 = 0; lVar5 != 0xe; lVar5 = lVar5 + 1) {
          offs[lVar5 + 2] = psVar3[lVar5 + 1] + offs[lVar5 + 1];
        }
        for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
          lVar5 = (long)length[uVar6];
          if (lVar5 != 0) {
            psVar3 = h->symbol;
            sVar2 = offs[lVar5];
            offs[lVar5] = sVar2 + 1;
            psVar3[sVar2] = (short)uVar6;
          }
        }
        return iVar4;
      }
      psVar1 = psVar3 + lVar5;
      lVar5 = lVar5 + 1;
      iVar4 = iVar4 * 2 - (int)*psVar1;
    } while (-1 < iVar4);
  }
  return iVar4;
}

Assistant:

local int construct(struct huffman *h, const short *length, int n)
{
    int symbol;         /* current symbol when stepping through length[] */
    int len;            /* current length when stepping through h->count[] */
    int left;           /* number of possible codes left of current length */
    short offs[MAXBITS+1];      /* offsets in symbol table for each length */

    /* count number of codes of each length */
    for (len = 0; len <= MAXBITS; len++)
        h->count[len] = 0;
    for (symbol = 0; symbol < n; symbol++)
        (h->count[length[symbol]])++;   /* assumes lengths are within bounds */
    if (h->count[0] == n)               /* no codes! */
        return 0;                       /* complete, but decode() will fail */

    /* check for an over-subscribed or incomplete set of lengths */
    left = 1;                           /* one possible code of zero length */
    for (len = 1; len <= MAXBITS; len++) {
        left <<= 1;                     /* one more bit, double codes left */
        left -= h->count[len];          /* deduct count from possible codes */
        if (left < 0)
            return left;                /* over-subscribed--return negative */
    }                                   /* left > 0 means incomplete */

    /* generate offsets into symbol table for each length for sorting */
    offs[1] = 0;
    for (len = 1; len < MAXBITS; len++)
        offs[len + 1] = offs[len] + h->count[len];

    /*
     * put symbols in table sorted by length, by symbol order within each
     * length
     */
    for (symbol = 0; symbol < n; symbol++)
        if (length[symbol] != 0)
            h->symbol[offs[length[symbol]]++] = symbol;

    /* return zero for complete set, positive for incomplete set */
    return left;
}